

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsa_asn1.cc
# Opt level: O0

int i2d_DSAPublicKey(DSA *a,uchar **pp)

{
  int iVar1;
  undefined1 local_50 [8];
  CBB cbb;
  uint8_t **outp_local;
  DSA *in_local;
  
  cbb.u._24_8_ = pp;
  iVar1 = CBB_init((CBB *)local_50,0);
  if ((iVar1 != 0) && (iVar1 = DSA_marshal_public_key((CBB *)local_50,(DSA *)a), iVar1 != 0)) {
    iVar1 = CBB_finish_i2d((CBB *)local_50,(uint8_t **)cbb.u._24_8_);
    return iVar1;
  }
  CBB_cleanup((CBB *)local_50);
  return -1;
}

Assistant:

int i2d_DSAPublicKey(const DSA *in, uint8_t **outp) {
  CBB cbb;
  if (!CBB_init(&cbb, 0) ||
      !DSA_marshal_public_key(&cbb, in)) {
    CBB_cleanup(&cbb);
    return -1;
  }
  return CBB_finish_i2d(&cbb, outp);
}